

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O0

CompileMessage * __thiscall
soul::CompileMessageHelpers::createMessage<char_const(&)[7],std::__cxx11::string>
          (CompileMessage *__return_storage_ptr__,CompileMessageHelpers *this,Category category,
          Type type,char *text,char (*args) [7],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  CodeLocation local_48;
  char (*local_30) [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [7];
  char *text_local;
  Type type_local;
  Category category_local;
  
  args_local = (char (*) [7])CONCAT44(in_register_0000000c,type);
  text_local._4_4_ = SUB84(this,0);
  local_48.sourceCode.object = (SourceCodeText *)0x0;
  local_48.location.data = (char *)0x0;
  local_30 = args;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)text;
  text_local._0_4_ = category;
  _type_local = __return_storage_ptr__;
  CodeLocation::CodeLocation(&local_48);
  createMessage<char_const(&)[7],std::__cxx11::string>
            (__return_storage_ptr__,(CompileMessageHelpers *)((ulong)this & 0xffffffff),
             (Category)&local_48,(CodeLocation *)(ulong)(Category)text_local,(Type)args_local,
             (char *)args_local_1,local_30,in_stack_ffffffffffffff80);
  CodeLocation::~CodeLocation(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static CompileMessage createMessage (CompileMessage::Category category, CompileMessage::Type type,
                                         const char* text, Args&&... args)
    {
        return createMessage (category, CodeLocation(), type, text, std::forward<Args> (args)...);
    }